

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::checkLayout
          (uint32_t struct_id,char *storage_class_str,char *decoration_str,bool blockRules,
          bool scalar_block_layout,uint32_t incoming_offset,MemberConstraints *constraints,
          ValidationState_t *vstate)

{
  ushort uVar1;
  uint16_t uVar2;
  spv_const_validator_options psVar3;
  bool bVar4;
  key_type kVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  spv_result_t sVar10;
  uint uVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  const_iterator cVar14;
  void *pvVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  _Rb_tree_node_base *p_Var18;
  byte bVar19;
  bool roundUp;
  long lVar20;
  ulong uVar21;
  _Rb_tree_color _Var22;
  _Rb_tree_color member_index;
  ulong uVar23;
  ulong uVar24;
  _Bit_type *__n;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  pointer pMVar28;
  _Rb_tree_color _Var29;
  _Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *this;
  FieldDecorationsIter FVar30;
  bool local_2f1;
  pointer local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  Instruction *local_2d8;
  ulong local_2d0;
  spv_result_t local_2c8;
  uint local_2c4;
  uint32_t struct_id_local;
  allocator_type local_2b9;
  mapped_type *local_2b8;
  uint local_2ac;
  key_type local_2a8;
  key_type kStack_2a0;
  _Bit_type *local_298;
  vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> member_offsets;
  long local_270;
  anon_class_40_7_b84d8406 fail;
  undefined1 local_208 [8];
  key_type kStack_200;
  _Bit_type *local_1f8;
  _Bit_pointer local_1e8;
  spv_result_t local_38;
  
  local_2d8 = (Instruction *)CONCAT44(local_2d8._4_4_,incoming_offset);
  psVar3 = vstate->options_;
  sVar10 = SPV_SUCCESS;
  if (psVar3->skip_block_layout == false) {
    roundUp = (bool)(~psVar3->uniform_buffer_standard_layout & blockRules);
    bVar19 = 1;
    if ((vstate->features_).env_relaxed_block_layout == false) {
      bVar19 = psVar3->relax_block_layout;
    }
    fail.vstate = vstate;
    struct_id_local = struct_id;
    fail.struct_id = struct_id;
    fail.storage_class_str = storage_class_str;
    fail.decoration_str = decoration_str;
    fail.blockRules = roundUp;
    fail.relaxed_block_layout = (bool)bVar19;
    fail.scalar_block_layout = scalar_block_layout;
    pIVar12 = ValidationState_t::FindDef(vstate,struct_id);
    local_2a8.first = 0;
    local_2a8.second = 0;
    kStack_2a0.first = 0;
    kStack_2a0.second = 0;
    local_298 = (_Bit_type *)0x0;
    if ((pIVar12->inst_).opcode == 0x1e) {
      pIVar13 = ValidationState_t::FindDef(vstate,struct_id);
      local_1f8 = (_Bit_type *)0x0;
      local_208._0_4_ = 0;
      local_208._4_4_ = 0;
      kStack_200.first = 0;
      kStack_200.second = 0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_208,
                 (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 2,
                 (pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      __n = local_298;
      kVar5 = local_2a8;
      local_2a8.first = local_208._0_4_;
      local_2a8.second = local_208._4_4_;
      kStack_2a0 = kStack_200;
      local_298 = local_1f8;
      local_1f8 = (_Bit_type *)0x0;
      local_208._0_4_ = 0;
      local_208._4_4_ = 0;
      kStack_200.first = 0;
      kStack_200.second = 0;
      if (kVar5 != (key_type)0x0) {
        __n = (_Bit_type *)((long)__n - (long)kVar5);
        operator_delete((void *)kVar5,(ulong)__n);
        if ((key_type)local_208 != (key_type)0x0) {
          __n = (_Bit_type *)((long)local_1f8 - (long)local_208);
          operator_delete((void *)local_208,(ulong)__n);
        }
      }
    }
    else {
      __n = (_Bit_type *)0x0;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2a8,(iterator)0x0,
                 &struct_id_local);
    }
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar25 = (uint)scalar_block_layout;
    if ((pIVar12->inst_).opcode == 0x1e) {
      this = (_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_> *)
             ((long)kStack_2a0 - (long)local_2a8 >> 2);
      if ((ulong)this >> 0x3c != 0) {
        std::__throw_length_error("vector::reserve");
      }
      if (kStack_2a0 != local_2a8) {
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_start =
             std::_Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::_M_allocate
                       (this,(size_t)__n);
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
             _M_impl.super__Vector_impl_data._M_start + (long)this;
        _Var29 = (_Rb_tree_color)((ulong)((long)kStack_2a0 - (long)local_2a8) >> 2);
        member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
             _M_impl.super__Vector_impl_data._M_start;
        if (_Var29 != _S_red) {
          member_index = _S_red;
          do {
            FVar30 = ValidationState_t::id_member_decorations(vstate,struct_id_local,member_index);
            cVar14 = FVar30.begin._M_node;
            if (cVar14._M_node == FVar30.end._M_node._M_node) {
              _Var22 = ~_S_red;
            }
            else {
              _Var22 = ~_S_red;
              do {
                if (cVar14._M_node[2]._M_color != member_index) {
                  __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x1d4,
                                "spv_result_t spvtools::val::(anonymous namespace)::checkLayout(uint32_t, const char *, const char *, bool, bool, uint32_t, MemberConstraints &, ValidationState_t &)"
                               );
                }
                if (cVar14._M_node[1]._M_color == 0x23) {
                  _Var22 = (cVar14._M_node[1]._M_parent)->_M_color;
                }
                cVar14._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar14._M_node);
              } while (cVar14._M_node != FVar30.end._M_node._M_node);
            }
            local_208._4_4_ = _Var22 + (int)local_2d8;
            local_208._0_4_ = member_index;
            std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                      (&member_offsets,(value_type *)local_208);
            pMVar28 = member_offsets.
                      super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            member_index = member_index + _S_black;
          } while (member_index != _Var29);
          if (member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_2f0 = member_offsets.
                        super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            uVar23 = (long)member_offsets.
                           super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)member_offsets.
                           super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            if (0 < (long)uVar23) {
              do {
                uVar27 = uVar23 + 1 >> 1;
                uVar21 = uVar27 * 8;
                pvVar15 = operator_new(uVar21,(nothrow_t *)&std::nothrow);
                if (pvVar15 != (void *)0x0) {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCo___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                            (local_2f0,pMVar28,pvVar15,uVar27);
                  goto LAB_002cc015;
                }
                bVar4 = 2 < uVar23;
                uVar23 = uVar27;
              } while (bVar4);
            }
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::MemberOffsetPair*,std::vector<spvtools::val::(anonymous_namespace)::checkLayout(unsigned_int,char_const*,char_const*,bool,bool,unsigned_int,std::unordered_map<std::pair<unsigned_int,unsigned_int>,spvtools::val::(anonymous_namespace)::LayoutConstraints,spvtools::val::(anonymous_namespace)::PairHash,std::equal_to<std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,spvtools::val::(anonymous_namespace)::LayoutCon___pvtools::val::(anonymous_namespace)::LayoutConstraints>>>&,spvtools::val::ValidationState_t&)::__0>>
                      (local_2f0,pMVar28);
            uVar21 = 0;
            pvVar15 = (void *)0x0;
LAB_002cc015:
            operator_delete(pvVar15,uVar21);
          }
        }
      }
    }
    else {
      local_208._0_4_ = 0;
      local_208._4_4_ = 0;
      std::vector<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>::push_back
                (&member_offsets,(value_type *)local_208);
    }
    pMVar28 = member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)member_offsets.super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      sVar10 = SPV_SUCCESS;
    }
    else {
      lVar20 = (long)member_offsets.
                     super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)member_offsets.
                     super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl
                     .super__Vector_impl_data._M_start >> 3;
      pIVar12 = (Instruction *)0x0;
      local_270 = 0;
      local_2f0 = member_offsets.
                  super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>._M_impl.
                  super__Vector_impl_data._M_start;
      do {
        local_2e8 = (ulong)pMVar28[local_270].member;
        local_2e0 = (ulong)pMVar28[local_270].offset;
        uVar9 = *(uint32_t *)((long)local_2a8 + local_2e8 * 4);
        local_208._4_4_ = pMVar28[local_270].member;
        local_208._0_4_ = struct_id_local;
        local_2d8 = pIVar12;
        pmVar16 = std::
                  unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
                  ::operator[](constraints,(key_type *)local_208);
        local_2c4 = (uint)roundUp;
        if (scalar_block_layout) {
          uVar6 = getScalarAlignment(uVar9,vstate);
        }
        else {
          uVar6 = getBaseAlignment(uVar9,roundUp,pmVar16,constraints,vstate);
        }
        uVar23 = (ulong)uVar6;
        pIVar12 = ValidationState_t::FindDef(vstate,uVar9);
        uVar1 = (pIVar12->inst_).opcode;
        local_2b8 = pmVar16;
        uVar7 = getSize(uVar9,pmVar16,constraints,vstate);
        pMVar28 = local_2f0;
        uVar8 = (uint32_t)local_2e8;
        if ((uint)local_2e0 == 0xffffffff) {
          checkLayout::anon_class_40_7_b84d8406::operator()
                    ((DiagnosticStream *)local_208,&fail,uVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"is missing an Offset decoration",0x1f);
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          pMVar28 = local_2f0;
          sVar10 = local_38;
          goto LAB_002cbfb3;
        }
        local_2d0 = uVar23;
        local_2ac = uVar25;
        if ((uVar1 == 0x17 & bVar19 & !scalar_block_layout) == 1) {
          uVar8 = getScalarAlignment((pIVar12->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2],vstate);
          uVar6 = (uint)local_2e0;
          if (uVar8 != 0) {
            uVar6 = (uint)((local_2e0 & 0xffffffff) % (ulong)uVar8);
          }
          if (uVar6 != 0) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"at offset ",10)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is not aligned to scalar element size ",0x27);
            goto LAB_002cc30a;
          }
          if ((uint)local_2e0 < (uint)local_2d8) {
LAB_002cc0e2:
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"at offset ",10)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," overlaps previous member ending at offset ",0x2b);
            goto LAB_002cc30a;
          }
          uVar9 = getSize(uVar9,local_2b8,constraints,vstate);
          if (uVar9 < 0x11) {
            if (0xf < ((uVar9 + (uint)local_2e0) - 1 ^ (uint)local_2e0)) {
LAB_002cc1fc:
              checkLayout::anon_class_40_7_b84d8406::operator()
                        ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"is an improperly straddling vector at offset ",0x2d);
              goto LAB_002cc30a;
            }
          }
          else if ((local_2e0 & 0xf) != 0) goto LAB_002cc1fc;
        }
        else {
          uVar11 = (uint)local_2e0;
          if (uVar6 != 0) {
            uVar11 = (uint)((local_2e0 & 0xffffffff) % uVar23);
          }
          if (uVar11 != 0) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"at offset ",10)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is not aligned to ",0x13);
LAB_002cc30a:
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            sVar10 = local_38;
            goto LAB_002cbfb3;
          }
          if ((uint)local_2e0 < (uint)local_2d8) goto LAB_002cc0e2;
          if (uVar1 != 0x18) {
            if ((uVar1 != 0x1e) ||
               (sVar10 = checkLayout(uVar9,storage_class_str,decoration_str,SUB41(local_2c4,0),
                                     scalar_block_layout,(uint)local_2e0,constraints,vstate),
               sVar10 == SPV_SUCCESS)) goto LAB_002cbbd1;
            goto LAB_002cbfb3;
          }
          uVar11 = local_2b8->matrix_stride;
          if (uVar6 != 0) {
            uVar11 = uVar11 % uVar6;
          }
          if (uVar11 != 0) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,uVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"is a matrix with stride ",0x18);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," not satisfying alignment to ",0x1d);
            goto LAB_002cc30a;
          }
        }
LAB_002cbbd1:
        uVar23 = 1L << ((byte)local_2e0 & 0xf);
        uVar21 = local_2d0 & 0xffffffff;
        while (((pIVar12->inst_).opcode & 0xfffe) == 0x1c) {
          uVar9 = (pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[2];
          local_2d8 = ValidationState_t::FindDef(vstate,uVar9);
          local_208._0_4_ = (pIVar12->inst_).result_id;
          pmVar17 = std::
                    map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                    ::operator[](&vstate->id_decorations_,(key_type_conflict *)local_208);
          uVar27 = 0;
          uVar6 = 0;
          for (p_Var18 = (pmVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var18 != &(pmVar17->_M_t)._M_impl.super__Rb_tree_header;
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
            if (p_Var18[1]._M_color == 6) {
              _Var29 = (p_Var18[1]._M_parent)->_M_color;
              uVar27 = (ulong)_Var29;
              if (_Var29 == _S_red) {
                checkLayout::anon_class_40_7_b84d8406::operator()
                          ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"contains an array with stride 0",0x1f);
              }
              else {
                if (((int)uVar21 != 0) && ((int)(uVar27 % uVar21) == 0)) goto LAB_002cbc85;
                checkLayout::anon_class_40_7_b84d8406::operator()
                          ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"contains an array with stride ",0x1e);
                std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," not satisfying alignment to ",0x1d);
                std::ostream::_M_insert<unsigned_long>((ulong)local_208);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
              pMVar28 = local_2f0;
              sVar10 = local_38;
              goto LAB_002cbfae;
            }
LAB_002cbc85:
            uVar6 = (uint)uVar27;
          }
          iVar26 = 1;
          if ((pIVar12->inst_).opcode == 0x1c) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)local_208,vstate,
                       (pIVar12->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[3]);
            iVar26 = local_208._0_4_ + (uint)(local_208._0_4_ == 0);
          }
          pMVar28 = local_2f0;
          uVar2 = (local_2d8->inst_).opcode;
          if (uVar2 == 0x18) {
            uVar11 = local_2b8->matrix_stride;
            if ((int)local_2d0 != 0) {
              uVar11 = (uint)((ulong)uVar11 % (local_2d0 & 0xffffffff));
            }
            if (uVar11 == 0) goto LAB_002cbe01;
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"is a matrix with stride ",0x18);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," not satisfying alignment to ",0x1d);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            goto LAB_002cc2a1;
          }
          if (uVar2 != 0x1e) goto LAB_002cbe01;
          local_2f1 = false;
          std::vector<bool,_std::allocator<bool>_>::vector
                    ((vector<bool,_std::allocator<bool>_> *)local_208,0x10,&local_2f1,&local_2b9);
          uVar11 = *(uint *)local_208 & (uint)uVar23;
          uVar21 = uVar23;
          uVar27 = local_2e0;
          while (uVar11 == 0) {
            uVar8 = (uint32_t)uVar27;
            sVar10 = checkLayout(uVar9,storage_class_str,decoration_str,SUB41(local_2c4,0),
                                 SUB41(local_2ac,0),uVar8,constraints,vstate);
            if (sVar10 != SPV_SUCCESS) {
              pMVar28 = local_2f0;
              if ((key_type)local_208 == (key_type)0x0) goto LAB_002cbfae;
              bVar4 = false;
              goto LAB_002cbd3a;
            }
            uVar24 = uVar21 | *(ulong *)local_208;
            *(ulong *)local_208 = uVar24;
            iVar26 = iVar26 + -1;
            if (iVar26 == 0) break;
            uVar21 = 1L << ((byte)(uVar8 + uVar6) & 0xf);
            uVar27 = (ulong)(uVar8 + uVar6);
            uVar11 = (uint)uVar24 >> (uVar8 + uVar6 & 0xf) & 1;
          }
          bVar4 = true;
          sVar10 = local_2c8;
LAB_002cbd3a:
          pMVar28 = local_2f0;
          operator_delete((void *)local_208,(long)local_1e8 - (long)local_208);
          local_2c8 = sVar10;
          if (!bVar4) goto LAB_002cbfae;
LAB_002cbe01:
          pmVar16 = local_2b8;
          uVar9 = (local_2d8->inst_).result_id;
          if (scalar_block_layout) {
            uVar11 = getScalarAlignment(uVar9,vstate);
            pmVar16 = local_2b8;
          }
          else {
            uVar11 = getBaseAlignment(uVar9,SUB41(local_2c4,0),local_2b8,constraints,vstate);
          }
          pIVar12 = local_2d8;
          uVar21 = (ulong)uVar11;
          uVar9 = getSize((local_2d8->inst_).result_id,pmVar16,constraints,vstate);
          pMVar28 = local_2f0;
          if (uVar6 < uVar9) {
            checkLayout::anon_class_40_7_b84d8406::operator()
                      ((DiagnosticStream *)local_208,&fail,(uint32_t)local_2e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"contains an array with stride ",0x1e);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,", but with an element size of ",0x1e);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
LAB_002cc2a1:
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            sVar10 = local_38;
            goto LAB_002cbfae;
          }
        }
        pIVar12 = (Instruction *)(ulong)(uVar7 + (uint)local_2e0);
        if ((!scalar_block_layout) && ((uVar1 | 2) == 0x1e)) {
          pIVar12 = (Instruction *)
                    (ulong)(-(int)local_2d0 & ((int)local_2d0 + uVar7 + (uint)local_2e0) - 1);
        }
        local_270 = local_270 + 1;
        sVar10 = SPV_SUCCESS;
      } while (local_270 != lVar20 + (ulong)(lVar20 == 0));
    }
LAB_002cbfae:
    if (pMVar28 != (pointer)0x0) {
LAB_002cbfb3:
      operator_delete(pMVar28,(long)member_offsets.
                                    super__Vector_base<MemberOffsetPair,_std::allocator<MemberOffsetPair>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pMVar28);
    }
    if (local_2a8 != (key_type)0x0) {
      operator_delete((void *)local_2a8,(long)local_298 - (long)local_2a8);
    }
  }
  return sVar10;
}

Assistant:

spv_result_t checkLayout(uint32_t struct_id, const char* storage_class_str,
                         const char* decoration_str, bool blockRules,
                         bool scalar_block_layout,
                         uint32_t incoming_offset,
                         MemberConstraints& constraints,
                         ValidationState_t& vstate) {
  if (vstate.options()->skip_block_layout) return SPV_SUCCESS;

  // blockRules are the same as bufferBlock rules if the uniform buffer
  // standard layout extension is being used.
  if (vstate.options()->uniform_buffer_standard_layout) blockRules = false;

  // Relaxed layout and scalar layout can both be in effect at the same time.
  // For example, relaxed layout is implied by Vulkan 1.1.  But scalar layout
  // is more permissive than relaxed layout.
  const bool relaxed_block_layout = vstate.IsRelaxedBlockLayout();

  auto fail = [&vstate, struct_id, storage_class_str, decoration_str,
               blockRules, relaxed_block_layout,
               scalar_block_layout](uint32_t member_idx) -> DiagnosticStream {
    DiagnosticStream ds =
        std::move(vstate.diag(SPV_ERROR_INVALID_ID, vstate.FindDef(struct_id))
                  << "Structure id " << struct_id << " decorated as "
                  << decoration_str << " for variable in " << storage_class_str
                  << " storage class must follow "
                  << (scalar_block_layout
                          ? "scalar "
                          : (relaxed_block_layout ? "relaxed " : "standard "))
                  << (blockRules ? "uniform buffer" : "storage buffer")
                  << " layout rules: member " << member_idx << " ");
    return ds;
  };

  // If we are checking the layout of untyped pointers or physical storage
  // buffer pointers, we may not actually have a struct here. Instead, pretend
  // we have a struct with a single member at offset 0.
  const auto& struct_type = vstate.FindDef(struct_id);
  std::vector<uint32_t> members;
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    members = getStructMembers(struct_id, vstate);
  } else {
    members.push_back(struct_id);
  }

  // To check for member overlaps, we want to traverse the members in
  // offset order.
  struct MemberOffsetPair {
    uint32_t member;
    uint32_t offset;
  };
  std::vector<MemberOffsetPair> member_offsets;

  // With untyped pointers or physical storage buffers, we might be checking
  // layouts that do not originate from a structure.
  if (struct_type->opcode() == spv::Op::OpTypeStruct) {
    member_offsets.reserve(members.size());
    for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
         memberIdx < numMembers; memberIdx++) {
      uint32_t offset = 0xffffffff;
      auto member_decorations =
          vstate.id_member_decorations(struct_id, memberIdx);
      for (auto decoration = member_decorations.begin;
           decoration != member_decorations.end; ++decoration) {
        assert(decoration->struct_member_index() == (int)memberIdx);
        switch (decoration->dec_type()) {
          case spv::Decoration::Offset:
            offset = decoration->params()[0];
            break;
          default:
            break;
        }
      }
      member_offsets.push_back(
          MemberOffsetPair{memberIdx, incoming_offset + offset});
    }
    std::stable_sort(
        member_offsets.begin(), member_offsets.end(),
        [](const MemberOffsetPair& lhs, const MemberOffsetPair& rhs) {
          return lhs.offset < rhs.offset;
        });
  } else {
    member_offsets.push_back({0, 0});
  }

  // Now scan from lowest offset to highest offset.
  uint32_t nextValidOffset = 0;
  for (size_t ordered_member_idx = 0;
       ordered_member_idx < member_offsets.size(); ordered_member_idx++) {
    const auto& member_offset = member_offsets[ordered_member_idx];
    const auto memberIdx = member_offset.member;
    const auto offset = member_offset.offset;
    auto id = members[member_offset.member];
    const LayoutConstraints& constraint =
        constraints[std::make_pair(struct_id, uint32_t(memberIdx))];
    // Scalar layout takes precedence because it's more permissive, and implying
    // an alignment that divides evenly into the alignment that would otherwise
    // be used.
    const auto alignment =
        scalar_block_layout
            ? getScalarAlignment(id, vstate)
            : getBaseAlignment(id, blockRules, constraint, constraints, vstate);
    const auto inst = vstate.FindDef(id);
    const auto opcode = inst->opcode();
    const auto size = getSize(id, constraint, constraints, vstate);
    // Check offset.
    if (offset == 0xffffffff)
      return fail(memberIdx) << "is missing an Offset decoration";
    if (!scalar_block_layout && relaxed_block_layout &&
        opcode == spv::Op::OpTypeVector) {
      // In relaxed block layout, the vector offset must be aligned to the
      // vector's scalar element type.
      const auto componentId = inst->words()[2];
      const auto scalar_alignment = getScalarAlignment(componentId, vstate);
      if (!IsAlignedTo(offset, scalar_alignment)) {
        return fail(memberIdx)
               << "at offset " << offset
               << " is not aligned to scalar element size " << scalar_alignment;
      }
    } else {
      // Without relaxed block layout, the offset must be divisible by the
      // alignment requirement.
      if (!IsAlignedTo(offset, alignment)) {
        return fail(memberIdx)
               << "at offset " << offset << " is not aligned to " << alignment;
      }
    }
    if (offset < nextValidOffset)
      return fail(memberIdx) << "at offset " << offset
                             << " overlaps previous member ending at offset "
                             << nextValidOffset - 1;
    if (!scalar_block_layout && relaxed_block_layout) {
      // Check improper straddle of vectors.
      if (spv::Op::OpTypeVector == opcode &&
          hasImproperStraddle(id, offset, constraint, constraints, vstate))
        return fail(memberIdx)
               << "is an improperly straddling vector at offset " << offset;
    }
    // Check struct members recursively.
    spv_result_t recursive_status = SPV_SUCCESS;
    if (spv::Op::OpTypeStruct == opcode &&
        SPV_SUCCESS != (recursive_status = checkLayout(
                            id, storage_class_str, decoration_str, blockRules,
                            scalar_block_layout, offset, constraints, vstate)))
      return recursive_status;
    // Check matrix stride.
    if (spv::Op::OpTypeMatrix == opcode) {
      const auto stride = constraint.matrix_stride;
      if (!IsAlignedTo(stride, alignment)) {
        return fail(memberIdx) << "is a matrix with stride " << stride
                               << " not satisfying alignment to " << alignment;
      }
    }

    // Check arrays and runtime arrays recursively.
    auto array_inst = inst;
    auto array_alignment = alignment;
    while (array_inst->opcode() == spv::Op::OpTypeArray ||
           array_inst->opcode() == spv::Op::OpTypeRuntimeArray) {
      const auto typeId = array_inst->word(2);
      const auto element_inst = vstate.FindDef(typeId);
      // Check array stride.
      uint32_t array_stride = 0;
      for (auto& decoration : vstate.id_decorations(array_inst->id())) {
        if (spv::Decoration::ArrayStride == decoration.dec_type()) {
          array_stride = decoration.params()[0];
          if (array_stride == 0) {
            return fail(memberIdx) << "contains an array with stride 0";
          }
          if (!IsAlignedTo(array_stride, array_alignment))
            return fail(memberIdx)
                   << "contains an array with stride " << decoration.params()[0]
                   << " not satisfying alignment to " << alignment;
        }
      }

      bool is_int32 = false;
      bool is_const = false;
      uint32_t num_elements = 0;
      if (array_inst->opcode() == spv::Op::OpTypeArray) {
        std::tie(is_int32, is_const, num_elements) =
            vstate.EvalInt32IfConst(array_inst->word(3));
      }
      num_elements = std::max(1u, num_elements);
      // Check each element recursively if it is a struct. There is a
      // limitation to this check if the array size is a spec constant or is a
      // runtime array then we will only check a single element. This means
      // some improper straddles might be missed.
      if (spv::Op::OpTypeStruct == element_inst->opcode()) {
        std::vector<bool> seen(16, false);
        for (uint32_t i = 0; i < num_elements; ++i) {
          uint32_t next_offset = i * array_stride + offset;
          // Stop checking if offsets repeat in terms of 16-byte multiples.
          if (seen[next_offset % 16]) {
            break;
          }

          if (SPV_SUCCESS !=
              (recursive_status = checkLayout(
                   typeId, storage_class_str, decoration_str, blockRules,
                   scalar_block_layout, next_offset, constraints, vstate)))
            return recursive_status;

          seen[next_offset % 16] = true;
        }
      } else if (spv::Op::OpTypeMatrix == element_inst->opcode()) {
        // Matrix stride would be on the array element in the struct.
        const auto stride = constraint.matrix_stride;
        if (!IsAlignedTo(stride, alignment)) {
          return fail(memberIdx)
                 << "is a matrix with stride " << stride
                 << " not satisfying alignment to " << alignment;
        }
      }

      // Proceed to the element in case it is an array.
      array_inst = element_inst;
      array_alignment = scalar_block_layout
                            ? getScalarAlignment(array_inst->id(), vstate)
                            : getBaseAlignment(array_inst->id(), blockRules,
                                               constraint, constraints, vstate);

      const auto element_size =
          getSize(element_inst->id(), constraint, constraints, vstate);
      if (element_size > array_stride) {
        return fail(memberIdx)
               << "contains an array with stride " << array_stride
               << ", but with an element size of " << element_size;
      }
    }
    nextValidOffset = offset + size;
    if (!scalar_block_layout &&
        (spv::Op::OpTypeArray == opcode || spv::Op::OpTypeStruct == opcode)) {
      // Non-scalar block layout rules don't permit anything in the padding of
      // a struct or array.
      nextValidOffset = align(nextValidOffset, alignment);
    }
  }
  return SPV_SUCCESS;
}